

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_standard_from_disk.unit.cpp
# Opt level: O1

void __thiscall
TestLoadStandardFromDisk_TestLoadCEN_Test::TestBody(TestLoadStandardFromDisk_TestLoadCEN_Test *this)

{
  char *message;
  ScopedTrace gtest_trace_262;
  AssertionResult gtest_ar;
  path std_path;
  Optical_Standard cen;
  ScopedTrace local_f9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  AssertHelper local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  path local_c8;
  Optical_Standard local_a0;
  
  testing::ScopedTrace::ScopedTrace
            (&local_f9,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
             ,0x106,"Begin Test: Load CEN from disk.");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_c8,&test_dir_abi_cxx11_,auto_format);
  std::filesystem::__cxx11::path::_M_append(&local_c8,9,"standards");
  std::filesystem::__cxx11::path::_M_append(&local_c8,0x10,"CENblackbody.std");
  local_e8 = (undefined1  [8])&local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,local_c8._M_pathname._M_dataplus._M_p,
             local_c8._M_pathname._M_dataplus._M_p + local_c8._M_pathname._M_string_length);
  window_standards::load_optical_standard(&local_a0,(string *)local_e8);
  if (local_e8 != (undefined1  [8])&local_d8) {
    operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
  }
  local_f8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_a0.methods._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_f0.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_e8,"cen.methods.size()","7",(unsigned_long *)&local_f8,
             (int *)&local_f0);
  if (local_e8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_f8._M_head_impl + 0x10),"Number of methods loaded",0x18);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]Windows-CalcStandards/test/read_standard_from_disk.unit.cpp"
               ,0x10d,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f8._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_window_standards::Optical_Standard_Method>_>_>
  ::~_Rb_tree(&local_a0.methods._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p != &local_a0.file.field_2) {
    operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.description._M_dataplus._M_p != &local_a0.description.field_2) {
    operator_delete(local_a0.description._M_dataplus._M_p,
                    local_a0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p,local_a0.name.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_c8);
  testing::ScopedTrace::~ScopedTrace(&local_f9);
  return;
}

Assistant:

TEST_F(TestLoadStandardFromDisk, TestLoadCEN) {
	SCOPED_TRACE("Begin Test: Load CEN from disk.");

	std::filesystem::path std_path(test_dir);
	std_path /= "standards";
	std_path /= "CENblackbody.std";

	Optical_Standard cen = load_optical_standard(std_path.string());	
	EXPECT_EQ(cen.methods.size(), 7) << "Number of methods loaded";

}